

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O1

void ts_subtree__print_dot_graph
               (Subtree *self,uint32_t start_offset,TSLanguage *language,TSSymbol alias_symbol,
               FILE *f)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  SubtreeHeapData *pSVar6;
  ulong uVar7;
  TSSymbol alias_symbol_00;
  ushort uVar8;
  char *__s;
  ulong uVar9;
  ulong uVar10;
  Subtree *pSVar11;
  char *c;
  char *pcVar12;
  TSSymbol *pTVar13;
  long lVar14;
  Length result;
  Length result_1;
  
  pSVar6 = self->ptr;
  if (((ulong)pSVar6 & 1) == 0) {
    uVar8 = pSVar6->symbol;
  }
  else {
    uVar8 = (ushort)(byte)((ulong)pSVar6 >> 8);
  }
  if (alias_symbol == 0) {
    alias_symbol = uVar8;
  }
  if (((ulong)pSVar6 & 1) == 0) {
    uVar2 = (pSVar6->padding).bytes;
  }
  else {
    uVar2 = (uint)((ulong)pSVar6 >> 0x10) & 0xff;
  }
  if (((ulong)pSVar6 & 1) == 0) {
    uVar3 = (pSVar6->size).bytes;
  }
  else {
    uVar3 = (uint)((ulong)pSVar6 >> 0x18) & 0xff;
  }
  fprintf((FILE *)f,"tree_%p [label=\"",self);
  if (alias_symbol == 0xffff) {
    pcVar12 = "ERROR";
  }
  else if (alias_symbol == 0xfffe) {
    pcVar12 = "_ERROR";
  }
  else {
    pcVar12 = language->symbol_names[alias_symbol];
  }
  do {
    cVar1 = *pcVar12;
    if (cVar1 == '\n') {
      __s = "\\n";
LAB_00133cec:
      fputs(__s,(FILE *)f);
    }
    else {
      if (cVar1 == '\"') {
        __s = "\\\"";
        goto LAB_00133cec;
      }
      if (cVar1 == '\0') {
        fputc(0x22,(FILE *)f);
        if ((((ulong)self->ptr & 1) != 0) || (self->ptr->child_count == 0)) {
          fwrite(", shape=plaintext",0x11,1,(FILE *)f);
        }
        pSVar6 = self->ptr;
        if (((ulong)pSVar6 & 1) == 0) {
          uVar4 = *(uint *)&pSVar6->field_0x2c >> 2;
        }
        else {
          uVar4 = (uint)((ulong)pSVar6 >> 3) & 0x1fffffff;
        }
        if ((uVar4 & 1) != 0) {
          fwrite(", fontcolor=gray",0x10,1,(FILE *)f);
        }
        pSVar6 = self->ptr;
        if (((ulong)pSVar6 & 1) == 0) {
          uVar8 = pSVar6->parse_state;
        }
        else {
          uVar8 = (ushort)((ulong)pSVar6 >> 0x30);
        }
        if (((ulong)pSVar6 & 1) == 0) {
          uVar4 = *(uint *)&pSVar6->field_0x2c >> 7;
        }
        else {
          uVar4 = (uint)((ulong)pSVar6 >> 5) & 0x7ffffff;
        }
        uVar9 = 0x262;
        if ((uVar4 & 1) == 0) {
          uVar9 = 0;
        }
        if ((char)(uVar4 & 1) == '\0' && ((ulong)pSVar6 & 1) == 0) {
          uVar9 = (ulong)pSVar6->error_cost;
        }
        if (((ulong)pSVar6 & 1) == 0) {
          uVar4 = *(uint *)&pSVar6->field_0x2c >> 5;
        }
        else {
          uVar4 = (uint)((ulong)pSVar6 >> 4) & 0xfffffff;
        }
        uVar10 = 0;
        if ((((ulong)pSVar6 & 1) == 0) && (pSVar6->child_count != 0)) {
          uVar10 = (ulong)(pSVar6->field_17).field_0.repeat_depth;
        }
        if (((ulong)pSVar6 & 1) == 0) {
          uVar5 = pSVar6->lookahead_bytes;
        }
        else {
          uVar5 = (uint)((ulong)pSVar6 >> 0x2c) & 0xf;
        }
        fprintf((FILE *)f,
                ", tooltip=\"range: %u - %u\nstate: %d\nerror-cost: %u\nhas-changes: %u\nrepeat-depth: %u\nlookahead-bytes: %u\"]\n"
                ,(ulong)start_offset,(ulong)(uVar3 + start_offset + uVar2),(ulong)uVar8,uVar9,
                (ulong)(uVar4 & 1),uVar10,(ulong)uVar5);
        pSVar6 = self->ptr;
        uVar2 = 0;
        if ((((ulong)pSVar6 & 1) == 0) && (uVar2 = 0, pSVar6->child_count != 0)) {
          uVar2 = (uint)(pSVar6->field_17).field_0.alias_sequence_id;
        }
        uVar9 = 0;
        if (uVar2 == 0) {
          pTVar13 = (TSSymbol *)0x0;
        }
        else {
          pTVar13 = language->alias_sequences + uVar2 * language->max_alias_sequence_length;
        }
        if (((ulong)pSVar6 & 1) == 0) {
          uVar9 = (ulong)pSVar6->child_count;
        }
        if ((int)uVar9 != 0) {
          lVar14 = 0;
          uVar10 = 0;
          uVar2 = 0;
          do {
            pSVar11 = (self->ptr->field_17).field_0.children;
            uVar7 = *(ulong *)((long)pSVar11 + lVar14);
            if ((uVar7 & 1) == 0) {
              uVar3 = *(uint *)(uVar7 + 0x2c) >> 2;
            }
            else {
              uVar3 = (uint)(uVar7 >> 3) & 0x1fffffff;
            }
            pSVar11 = (Subtree *)((long)pSVar11 + lVar14);
            if ((uVar3 & 1) == 0) {
              if (pTVar13 == (TSSymbol *)0x0) {
                alias_symbol_00 = 0;
              }
              else {
                alias_symbol_00 = pTVar13[uVar2];
              }
              ts_subtree__print_dot_graph(pSVar11,start_offset,language,alias_symbol_00,f);
              uVar2 = uVar2 + 1;
            }
            else {
              ts_subtree__print_dot_graph(pSVar11,start_offset,language,0,f);
            }
            fprintf((FILE *)f,"tree_%p -> tree_%p [tooltip=%u]\n",self,pSVar11,uVar10);
            pSVar6 = pSVar11->ptr;
            if (((ulong)pSVar6 & 1) == 0) {
              uVar4 = (pSVar6->padding).bytes;
            }
            else {
              uVar4 = (uint)((ulong)pSVar6 >> 0x10) & 0xff;
            }
            if (((ulong)pSVar6 & 1) == 0) {
              uVar5 = (pSVar6->size).bytes;
            }
            else {
              uVar5 = (uint)((ulong)pSVar6 >> 0x18) & 0xff;
            }
            start_offset = start_offset + uVar5 + uVar4;
            uVar10 = (ulong)((int)uVar10 + 1);
            lVar14 = lVar14 + 8;
          } while (uVar9 << 3 != lVar14);
        }
        return;
      }
      fputc((int)cVar1,(FILE *)f);
    }
    pcVar12 = pcVar12 + 1;
  } while( true );
}

Assistant:

void ts_subtree__print_dot_graph(const Subtree *self, uint32_t start_offset,
                                 const TSLanguage *language, TSSymbol alias_symbol,
                                 FILE *f) {
  TSSymbol subtree_symbol = ts_subtree_symbol(*self);
  TSSymbol symbol = alias_symbol ? alias_symbol : subtree_symbol;
  uint32_t end_offset = start_offset + ts_subtree_total_bytes(*self);
  fprintf(f, "tree_%p [label=\"", self);
  ts_subtree__write_dot_string(f, ts_language_symbol_name(language, symbol));
  fprintf(f, "\"");

  if (ts_subtree_child_count(*self) == 0) fprintf(f, ", shape=plaintext");
  if (ts_subtree_extra(*self)) fprintf(f, ", fontcolor=gray");

  fprintf(f, ", tooltip=\""
    "range: %u - %u\n"
    "state: %d\n"
    "error-cost: %u\n"
    "has-changes: %u\n"
    "repeat-depth: %u\n"
    "lookahead-bytes: %u\"]\n",
    start_offset, end_offset,
    ts_subtree_parse_state(*self),
    ts_subtree_error_cost(*self),
    ts_subtree_has_changes(*self),
    ts_subtree_repeat_depth(*self),
    ts_subtree_lookahead_bytes(*self)
  );

  uint32_t child_start_offset = start_offset;
  uint32_t structural_child_index = 0;
  const TSSymbol *alias_sequence = ts_language_alias_sequence(
    language,
    ts_subtree_alias_sequence_id(*self)
  );
  for (uint32_t i = 0, n = ts_subtree_child_count(*self); i < n; i++) {
    const Subtree *child = &self->ptr->children[i];
    if (ts_subtree_extra(*child)) {
      ts_subtree__print_dot_graph(child, child_start_offset, language, 0, f);
    } else {
      TSSymbol alias_symbol = alias_sequence ? alias_sequence[structural_child_index] : 0;
      ts_subtree__print_dot_graph(child, child_start_offset, language, alias_symbol, f);
      structural_child_index++;
    }
    fprintf(f, "tree_%p -> tree_%p [tooltip=%u]\n", self, child, i);
    child_start_offset += ts_subtree_total_bytes(*child);
  }
}